

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.cpp
# Opt level: O2

int __thiscall
hbm::streaming::StreamClient::start
          (StreamClient *this,string *address,string *streamPort,string *controlPort)

{
  uint signalNumber;
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  Value *pVVar4;
  ostream *poVar5;
  socklen_t __len;
  ulong uVar6;
  size_t sVar7;
  size_t __n;
  size_t len;
  TransportHeader transportHeader;
  MetaInformation metaInformation;
  string method;
  Value local_2060;
  uchar dataRecvBuffer [8192];
  
  __len = (socklen_t)controlPort;
  std::__cxx11::string::string
            ((string *)dataRecvBuffer,(address->_M_dataplus)._M_p,(allocator *)&metaInformation);
  iVar1 = SocketNonblocking::connect
                    (&this->m_streamSocket,(int)dataRecvBuffer,(sockaddr *)streamPort,__len);
  std::__cxx11::string::~string((string *)dataRecvBuffer);
  if (iVar1 < 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"could not connect to streming port ");
    poVar5 = std::operator<<(poVar5,(string *)address);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = std::operator<<(poVar5,(string *)streamPort);
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar1 = -1;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->m_address);
    std::__cxx11::string::_M_assign((string *)&this->m_streamPort);
    std::__cxx11::string::_M_assign((string *)&this->m_controlPort);
    TransportHeader::TransportHeader(&transportHeader,&this->m_streamSocket);
LAB_00119e78:
    sVar2 = TransportHeader::receive(&transportHeader);
    signalNumber = transportHeader.m_signalNumber;
    iVar1 = (int)sVar2;
    if (-1 < iVar1) {
      if (transportHeader.m_type == TYPE_META) {
        MetaInformation::MetaInformation
                  (&metaInformation,&this->m_streamSocket,transportHeader.m_dataByteCount);
        if (metaInformation.m_type == 1) {
          Json::Value::Value(&local_2060,&metaInformation.m_jsonContent);
          pVVar4 = Json::Value::operator[](&local_2060,"method");
          Json::Value::asString_abi_cxx11_(&method,pVVar4);
          pVVar4 = Json::Value::operator[](&local_2060,"params");
          if (signalNumber == 0) {
            processStreamMetaInformation(this,&method,pVVar4);
          }
          else if (this->m_pSignalContainer != (SignalContainer *)0x0) {
            SignalContainer::processMetaInformation
                      (this->m_pSignalContainer,signalNumber,&method,pVVar4);
          }
          std::__cxx11::string::~string((string *)&method);
          Json::Value::~Value(&local_2060);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,"Signal number ");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          poVar5 = std::operator<<(poVar5,": unhandled meta information of type ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,metaInformation.m_type);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        MetaInformation::~MetaInformation(&metaInformation);
      }
      else if (transportHeader.m_type == TYPE_DATA) {
        __n = 0;
        for (sVar7 = transportHeader.m_dataByteCount; sVar7 != 0; sVar7 = sVar7 - len) {
          uVar6 = 0x2000;
          if (sVar7 < 0x2000) {
            uVar6 = sVar7;
          }
          sVar2 = SocketNonblocking::receiveComplete
                            (&this->m_streamSocket,dataRecvBuffer + __n,uVar6 - __n);
          if (sVar2 < 1) break;
          len = sVar2 + __n;
          if (this->m_pSignalContainer == (SignalContainer *)0x0) {
            __n = 0;
          }
          else {
            sVar3 = SignalContainer::processMeasuredData
                              (this->m_pSignalContainer,signalNumber,dataRecvBuffer,len);
            __n = len - sVar3;
            memmove(dataRecvBuffer,dataRecvBuffer + sVar3,__n);
            len = sVar3;
          }
        }
      }
      goto LAB_00119e78;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"stream client ");
    poVar5 = std::operator<<(poVar5,(string *)&this->m_address);
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = std::operator<<(poVar5,(string *)&this->m_streamPort);
    poVar5 = std::operator<<(poVar5," stopped");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  return iVar1;
}

Assistant:

int StreamClient::start(const std::string& address, const std::string &streamPort, const std::string& controlPort)
		{
			int result = m_streamSocket.connect(address.c_str(), streamPort);
			if (result < 0) {
				std::cerr << "could not connect to streming port " << address << ":" << streamPort << std::endl;
				return -1;
			}

			m_address = address;
			m_streamPort = streamPort;
			m_controlPort = controlPort;

			unsigned char dataRecvBuffer[8192];

			TransportHeader transportHeader(m_streamSocket);
			do {
				result = transportHeader.receive();
				if (result < 0) {
					break;
				}
				int type = transportHeader.type();
				size_t bytesToProcess = transportHeader.size();
				unsigned int signalNumber = transportHeader.signalNumber();

				if (type == TYPE_DATA) {
					// read and process measured data. This happens really often! Be sure to be as efficient as possible here.

					size_t bytesInBuffer = 0;
					size_t bytesToReadToBuffer;
					while(bytesToProcess>0) {
						if(bytesToProcess>sizeof(dataRecvBuffer)) {
							bytesToReadToBuffer = sizeof(dataRecvBuffer)-bytesInBuffer;
						} else {
							bytesToReadToBuffer = bytesToProcess-bytesInBuffer;
						}
						ssize_t bytesReadToBuffer = m_streamSocket.receiveComplete(dataRecvBuffer+bytesInBuffer, bytesToReadToBuffer);
						if(bytesReadToBuffer<=0) {
							break;
						}
						bytesInBuffer += bytesReadToBuffer;

						if (m_pSignalContainer) {
							size_t bytesProcessedFromBuffer = m_pSignalContainer->processMeasuredData(signalNumber, dataRecvBuffer, bytesInBuffer);
							bytesToProcess -= bytesProcessedFromBuffer;
							bytesInBuffer -= bytesProcessedFromBuffer;
							memmove(dataRecvBuffer, dataRecvBuffer+bytesProcessedFromBuffer, bytesInBuffer);
						} else {
							bytesToProcess -= bytesInBuffer;
							bytesInBuffer = 0;
						}
					}
				} else if (type == TYPE_META){
					MetaInformation metaInformation(m_streamSocket, bytesToProcess);
					if(metaInformation.type()!=METAINFORMATION_JSON) {
						std::cout << "Signal number " << signalNumber << ": unhandled meta information of type " << metaInformation.type() << std::endl;
					} else {
						const Json::Value& content = metaInformation.jsonContent();
						std::string method = content[METHOD].asString();
						const Json::Value& params = content[PARAMS];

						if (signalNumber == 0) {
							// stream related meta information
							processStreamMetaInformation(method, params);
						} else {
							// signal related meta information
							if (m_pSignalContainer) {
								m_pSignalContainer->processMetaInformation(signalNumber, method, params);
							}
						}
					}
				}
			} while(true);
			
			std::cout << "stream client " << m_address << ":" << m_streamPort << " stopped" << std::endl;

			return result;
		}